

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

void do_reduce(DisasContext_conflict1 *s,arg_rpr_esz *a,gen_helper_fp_reduce *fn)

{
  uint oprsz;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  TCGv_i32 pTVar4;
  TCGv_i64 v;
  TCGv_ptr ret;
  TCGv_ptr ret_00;
  TCGv_ptr pTVar5;
  uintptr_t o_3;
  uintptr_t o_1;
  uintptr_t o_4;
  uintptr_t o;
  uintptr_t o_2;
  
  tcg_ctx = s->uc->tcg_ctx;
  oprsz = s->sve_len;
  uVar2 = (ulong)oprsz - 1;
  if (uVar2 == 0) {
    uVar3 = 0x40;
  }
  else {
    uVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x3f;
  }
  uVar1 = (uint32_t)(oprsz == 0);
  if (uVar3 != 0) {
    uVar1 = (uint32_t)(0x8000000000000000 >> ((char)uVar3 - 1U & 0x3f));
  }
  uVar1 = simd_desc_aarch64(oprsz,uVar1,0);
  pTVar4 = tcg_const_i32_aarch64(tcg_ctx,uVar1);
  v = tcg_temp_new_i64(tcg_ctx);
  ret = tcg_temp_new_ptr(tcg_ctx);
  ret_00 = tcg_temp_new_ptr(tcg_ctx);
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,(TCGv_i64)ret,(TCGv_i64)tcg_ctx->cpu_env,(long)(a->rn * 0x100 + 0xc10));
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,(TCGv_i64)ret_00,(TCGv_i64)tcg_ctx->cpu_env,(long)(a->pg * 0x20 + 0x2c10));
  pTVar5 = get_fpstatus_ptr_aarch64(tcg_ctx,a->esz == 1);
  (*fn)(tcg_ctx,v,ret,ret_00,pTVar5,pTVar4);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  write_fp_dreg_aarch64(s,a->rd,v);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(v + (long)tcg_ctx));
  return;
}

Assistant:

static void do_reduce(DisasContext *s, arg_rpr_esz *a,
                      gen_helper_fp_reduce *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned vsz = vec_full_reg_size(s);
    unsigned p2vsz = pow2ceil(vsz);
    TCGv_i32 t_desc = tcg_const_i32(tcg_ctx, simd_desc(vsz, p2vsz, 0));
    TCGv_ptr t_zn, t_pg, status;
    TCGv_i64 temp;

    temp = tcg_temp_new_i64(tcg_ctx);
    t_zn = tcg_temp_new_ptr(tcg_ctx);
    t_pg = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, t_zn, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rn));
    tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));
    status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);

    fn(tcg_ctx, temp, t_zn, t_pg, status, t_desc);
    tcg_temp_free_ptr(tcg_ctx, t_zn);
    tcg_temp_free_ptr(tcg_ctx, t_pg);
    tcg_temp_free_ptr(tcg_ctx, status);
    tcg_temp_free_i32(tcg_ctx, t_desc);

    write_fp_dreg(s, a->rd, temp);
    tcg_temp_free_i64(tcg_ctx, temp);
}